

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

void VP8CalculateLevelCosts(VP8EncProba *proba)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t (*pauVar3) [68];
  CostArrayMap *paapuVar4;
  long lVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t (*pauVar9) [11];
  CostArray *paauVar10;
  long lVar11;
  uint16_t uVar12;
  short sVar13;
  CostArrayMap *paapuVar14;
  long lVar15;
  long lVar16;
  uint8_t *puVar17;
  uint uVar18;
  uint uVar19;
  CostArray (*paaauVar20) [8];
  
  if (proba->dirty_ != 0) {
    paapuVar14 = proba->remapped_costs_;
    puVar8 = proba->coeffs_[0][0][0] + 2;
    paaauVar20 = proba->level_cost_;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      puVar7 = puVar8;
      for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
        puVar6 = puVar7;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          pauVar9 = proba->coeffs_[lVar11][lVar16] + lVar5;
          if (lVar5 == 0) {
            uVar12 = 0;
          }
          else {
            uVar12 = VP8EntropyCost[(*pauVar9)[0] ^ 0xff];
          }
          pauVar3 = proba->level_cost_[lVar11][lVar16] + lVar5;
          bVar1 = (*pauVar9)[1];
          uVar2 = VP8EntropyCost[(byte)~bVar1];
          (*pauVar3)[0] = uVar12 + VP8EntropyCost[bVar1];
          for (lVar15 = 1; lVar15 != 0x44; lVar15 = lVar15 + 1) {
            uVar19 = (uint)*(ushort *)(&DAT_0014bd4e + lVar15 * 4);
            sVar13 = 0;
            puVar17 = puVar6;
            for (uVar18 = (uint)*(ushort *)(&DAT_0014bd4c + lVar15 * 4); uVar18 != 0;
                uVar18 = uVar18 >> 1) {
              if ((uVar18 & 1) != 0) {
                sVar13 = sVar13 + VP8EntropyCost[(byte)(-((byte)uVar19 & 1) ^ *puVar17)];
              }
              uVar19 = uVar19 >> 1;
              puVar17 = puVar17 + 1;
            }
            (*pauVar3)[lVar15] = sVar13 + uVar2 + uVar12;
          }
          puVar6 = puVar6 + 0xb;
        }
        puVar7 = puVar7 + 0x21;
      }
      paapuVar4 = paapuVar14;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        paauVar10 = *paaauVar20 + ""[lVar16];
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          (*paapuVar4)[0][lVar5] = (uint16_t *)paauVar10;
          paauVar10 = (CostArray *)(*paauVar10 + 1);
        }
        paapuVar4 = (CostArrayMap *)(*paapuVar4 + 1);
      }
      puVar8 = puVar8 + 0x108;
      paaauVar20 = paaauVar20 + 1;
      paapuVar14 = paapuVar14 + 1;
    }
    proba->dirty_ = 0;
  }
  return;
}

Assistant:

void VP8CalculateLevelCosts(VP8EncProba* const proba) {
  int ctype, band, ctx;

  if (!proba->dirty_) return;  // nothing to do.

  for (ctype = 0; ctype < NUM_TYPES; ++ctype) {
    int n;
    for (band = 0; band < NUM_BANDS; ++band) {
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        const uint8_t* const p = proba->coeffs_[ctype][band][ctx];
        uint16_t* const table = proba->level_cost_[ctype][band][ctx];
        const int cost0 = (ctx > 0) ? VP8BitCost(1, p[0]) : 0;
        const int cost_base = VP8BitCost(1, p[1]) + cost0;
        int v;
        table[0] = VP8BitCost(0, p[1]) + cost0;
        for (v = 1; v <= MAX_VARIABLE_LEVEL; ++v) {
          table[v] = cost_base + VariableLevelCost(v, p);
        }
        // Starting at level 67 and up, the variable part of the cost is
        // actually constant.
      }
    }
    for (n = 0; n < 16; ++n) {    // replicate bands. We don't need to sentinel.
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        proba->remapped_costs_[ctype][n][ctx] =
            proba->level_cost_[ctype][VP8EncBands[n]][ctx];
      }
    }
  }
  proba->dirty_ = 0;
}